

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O0

void Sbd_StoRefObj(Sbd_Sto_t *p,int iObj,int iMirror)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj_00;
  int local_60;
  int local_5c;
  int Lit0m_1;
  int Fan1;
  int Fan0;
  int Lit1m;
  int Lit0m;
  Gia_Obj_t *pObj;
  int iMirror_local;
  int iObj_local;
  Sbd_Sto_t *p_local;
  
  pObj_00 = Gia_ManObj(p->pGia,iObj);
  iVar2 = Vec_IntSize(p->vRefs);
  if (iObj != iVar2) {
    __assert_fail("iObj == Vec_IntSize(p->vRefs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2f1,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
  }
  if (iObj <= iMirror) {
    __assert_fail("iMirror < iObj",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2f2,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
  }
  Vec_IntPush(p->vRefs,0);
  if (0 < iMirror) {
    pVVar1 = p->vRefs;
    iVar2 = Vec_IntEntry(p->vRefs,iMirror);
    Vec_IntWriteEntry(pVVar1,iObj,iVar2);
    Vec_IntWriteEntry(p->vRefs,iMirror,1);
  }
  iVar2 = Gia_ObjIsAnd(pObj_00);
  if (iVar2 == 0) {
    iVar2 = Gia_ObjIsCo(pObj_00);
    if (iVar2 != 0) {
      pVVar1 = p->vMirrors;
      iVar2 = Gia_ObjFaninId0(pObj_00,iObj);
      iVar2 = Vec_IntEntry(pVVar1,iVar2);
      if (iVar2 != -1) {
        __assert_fail("Lit0m == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                      ,0x306,"void Sbd_StoRefObj(Sbd_Sto_t *, int, int)");
      }
      pVVar1 = p->vRefs;
      iVar2 = Gia_ObjFaninId0(pObj_00,iObj);
      Vec_IntAddToEntry(pVVar1,iVar2,1);
    }
  }
  else {
    pVVar1 = p->vMirrors;
    iVar2 = Gia_ObjFaninId0(pObj_00,iObj);
    iVar2 = Vec_IntEntry(pVVar1,iVar2);
    pVVar1 = p->vMirrors;
    iVar3 = Gia_ObjFaninId1(pObj_00,iObj);
    iVar3 = Vec_IntEntry(pVVar1,iVar3);
    if (iVar2 < 0) {
      local_5c = Gia_ObjFaninId0(pObj_00,iObj);
    }
    else {
      local_5c = Abc_Lit2Var(iVar2);
    }
    if (iVar3 < 0) {
      local_60 = Gia_ObjFaninId1(pObj_00,iObj);
    }
    else {
      local_60 = Abc_Lit2Var(iVar3);
    }
    Vec_IntAddToEntry(p->vRefs,local_5c,1);
    Vec_IntAddToEntry(p->vRefs,local_60,1);
  }
  return;
}

Assistant:

void Sbd_StoRefObj( Sbd_Sto_t * p, int iObj, int iMirror )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    assert( iObj == Vec_IntSize(p->vRefs) );
    assert( iMirror < iObj );
    Vec_IntPush( p->vRefs, 0 );
//printf( "Ref %d\n", iObj );
    if ( iMirror > 0 )
    {
        Vec_IntWriteEntry( p->vRefs, iObj, Vec_IntEntry(p->vRefs, iMirror) );
        Vec_IntWriteEntry( p->vRefs, iMirror, 1 );
    }
    if ( Gia_ObjIsAnd(pObj) )
    {
        int Lit0m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        int Lit1m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId1(pObj, iObj) );
        int Fan0 = Lit0m >= 0 ? Abc_Lit2Var(Lit0m) : Gia_ObjFaninId0(pObj, iObj);
        int Fan1 = Lit1m >= 0 ? Abc_Lit2Var(Lit1m) : Gia_ObjFaninId1(pObj, iObj);
        Vec_IntAddToEntry( p->vRefs, Fan0, 1 );
        Vec_IntAddToEntry( p->vRefs, Fan1, 1 );
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        int Lit0m = Vec_IntEntry( p->vMirrors, Gia_ObjFaninId0(pObj, iObj) );
        assert( Lit0m == -1 );
        Vec_IntAddToEntry( p->vRefs, Gia_ObjFaninId0(pObj, iObj), 1 );
    }
}